

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  char *__n;
  TestPartResultArray *this;
  char *__dest;
  TestPartResult *pTVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  size_t i;
  char *pcVar4;
  AssertionResult *this_00;
  ostream *this_01;
  ostream *poVar5;
  undefined4 in_register_00000084;
  long lVar6;
  int index;
  AssertionResult AVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  undefined1 local_68 [8];
  String expected;
  AssertionResult local_50;
  AssertionResult *local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  expected.length_._4_4_ = (Type)substr;
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar4 = "1 non-fatal failure";
  if (expected.length_._4_4_ == kFatalFailure) {
    pcVar4 = "1 fatal failure";
  }
  lVar6 = (ulong)(expected.length_._4_4_ != kFatalFailure) * 4;
  __n = (char *)(lVar6 + 0xf);
  local_40 = (AssertionResult *)param_1;
  __dest = (char *)operator_new__(lVar6 + 0x10);
  memcpy(__dest,pcVar4,(size_t)__n);
  __dest[lVar6 + 0xf] = '\0';
  local_68 = (undefined1  [8])__dest;
  expected.c_str_ = __n;
  Message::Message((Message *)&local_38);
  if ((*(long *)(this + 8) - *(long *)this & 0x3fffffffc0U) == 0x40) {
    pTVar1 = TestPartResultArray::GetTestPartResult(this,0);
    if (pTVar1->type_ == expected.length_._4_4_) {
      pcVar4 = strstr((pTVar1->message_).c_str_,(in_stack_00000008->_M_dataplus)._M_p);
      this_00 = local_40;
      if (pcVar4 != (char *)0x0) {
        local_40->success_ = true;
        (local_40->message_).ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        sVar3.ptr_ = extraout_RDX;
        goto LAB_0011f5c8;
      }
      local_50.success_ = false;
      local_50.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_50,(char (*) [11])0x135a87);
      pAVar2 = AssertionResult::operator<<(pAVar2,(String *)local_68);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [14])" containing \"");
      pAVar2 = AssertionResult::operator<<(pAVar2,in_stack_00000008);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x136286);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])"  Actual:\n");
      pAVar2 = AssertionResult::operator<<(pAVar2,pTVar1);
      AssertionResult::AssertionResult(this_00,pAVar2);
    }
    else {
      local_50.success_ = false;
      local_50.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_50,(char (*) [11])0x135a87);
      this_00 = local_40;
      pAVar2 = AssertionResult::operator<<(pAVar2,(String *)local_68);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1361d3);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])"  Actual:\n");
      pAVar2 = AssertionResult::operator<<(pAVar2,pTVar1);
      AssertionResult::AssertionResult(this_00,pAVar2);
    }
  }
  else {
    poVar5 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Expected: ",10);
    poVar5 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    pcVar4 = (char *)0x0;
    do {
      if (__dest[(long)pcVar4] == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\0",2);
      }
      else {
        local_50.success_ = (bool)__dest[(long)pcVar4];
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_50.success_,1);
      }
      pcVar4 = pcVar4 + 1;
    } while (__n != pcVar4);
    poVar5 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    poVar5 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Actual: ",10);
    this_01 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_01 = (ostream *)0x0;
    }
    std::ostream::operator<<(this_01,(int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6));
    this_00 = local_40;
    poVar5 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," failures",9);
    if (0 < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6)) {
      index = 0;
      do {
        poVar5 = (ostream *)(local_38.ptr_ + 0x10);
        if (local_38.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          poVar5 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        pTVar1 = TestPartResultArray::GetTestPartResult(this,index);
        poVar5 = (ostream *)(local_38.ptr_ + 0x10);
        if (local_38.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          poVar5 = (ostream *)0x0;
        }
        testing::operator<<(poVar5,pTVar1);
        index = index + 1;
      } while (index < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6));
    }
    local_50.success_ = false;
    local_50.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar2 = AssertionResult::operator<<(&local_50,(Message *)&local_38);
    AssertionResult::AssertionResult(this_00,pAVar2);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar3.ptr_ = extraout_RDX_00;
LAB_0011f5c8:
  if (local_38.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38.ptr_ + 8))();
    sVar3.ptr_ = extraout_RDX_01;
  }
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete__((void *)local_68);
    sVar3.ptr_ = extraout_RDX_02;
  }
  AVar7.message_.ptr_ = sVar3.ptr_;
  AVar7._0_8_ = this_00;
  return AVar7;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const string& substr) {
  const String expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == NULL) {
    return AssertionFailure() << "Expected: " << expected << " containing \""
                              << substr << "\"\n"
                              << "  Actual:\n"
                              << r;
  }

  return AssertionSuccess();
}